

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O0

ostream * Eigen::internal::print_matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
                    (ostream *s,Matrix<double,__1,_1,_0,__1,_1> *_m,IOFormat *fmt)

{
  long lVar1;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar2;
  int iVar3;
  Index IVar4;
  ostream *poVar5;
  Index IVar6;
  Index IVar7;
  Scalar *pSVar8;
  long *plVar9;
  long local_230;
  Index j_1;
  Index i_1;
  long local_200 [3];
  long local_1e8;
  stringstream sstr;
  undefined1 local_1d8 [376];
  long local_60;
  Index i;
  Index j;
  streamsize sStack_48;
  bool align_cols;
  streamsize old_precision;
  streamsize explicit_precision;
  Index width;
  Nested m;
  IOFormat *fmt_local;
  Matrix<double,__1,_1,_0,__1,_1> *_m_local;
  ostream *s_local;
  
  m = (Nested)fmt;
  fmt_local = (IOFormat *)_m;
  _m_local = (Matrix<double,__1,_1,_0,__1,_1> *)s;
  IVar4 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)_m);
  if (IVar4 == 0) {
    poVar5 = std::operator<<((ostream *)_m_local,(string *)m);
    std::operator<<(poVar5,(string *)(m + 2));
    s_local = (ostream *)_m_local;
  }
  else {
    width = (Index)fmt_local;
    explicit_precision = 0;
    if (*(int *)&m[0xe].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data == -1) {
      old_precision = 0;
    }
    else {
      if (*(int *)&m[0xe].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data == -2) {
        iVar3 = significant_decimals_impl<double>::run();
      }
      else {
        iVar3 = *(int *)&m[0xe].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data;
      }
      old_precision = (streamsize)iVar3;
    }
    sStack_48 = 0;
    if (old_precision != 0) {
      sStack_48 = std::ios_base::precision
                            ((ios_base *)
                             ((long)&(_m_local->
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                                     .m_storage.m_data +
                             (long)(_m_local->
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                   m_storage.m_data[-3]),old_precision);
    }
    j._7_1_ = (((ulong)m[0xe].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data & 0x100000000) != 0 ^ 0xffU) & 1;
    if (j._7_1_ != 0) {
      for (i = 0; IVar7 = i,
          IVar6 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::cols
                            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)width),
          IVar7 < IVar6; i = i + 1) {
        for (local_60 = 0; lVar1 = local_60,
            IVar7 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
                              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)width),
            lVar1 < IVar7; local_60 = local_60 + 1) {
          std::__cxx11::stringstream::stringstream((stringstream *)&local_1e8);
          std::ios::copyfmt((ios *)((long)&local_1e8 + *(long *)(local_1e8 + -0x18)));
          pSVar8 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::coeff
                             ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)width,
                              local_60,i);
          std::ostream::operator<<(local_1d8,*pSVar8);
          std::__cxx11::stringstream::str();
          local_200[0] = std::__cxx11::string::length();
          plVar9 = std::max<long>(&explicit_precision,local_200);
          explicit_precision = *plVar9;
          std::__cxx11::string::~string((string *)&i_1);
          std::__cxx11::stringstream::~stringstream((stringstream *)&local_1e8);
        }
      }
    }
    std::operator<<((ostream *)_m_local,(string *)m);
    for (j_1 = 0; IVar7 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
                                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                     width), j_1 < IVar7; j_1 = j_1 + 1) {
      if (j_1 != 0) {
        std::operator<<((ostream *)_m_local,(string *)(m + 10));
      }
      std::operator<<((ostream *)_m_local,(string *)(m + 4));
      if (explicit_precision != 0) {
        std::ios_base::width
                  ((ios_base *)
                   ((long)&(_m_local->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                           ).m_storage.m_data +
                   (long)(_m_local->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data[-3]),explicit_precision);
      }
      pMVar2 = _m_local;
      pSVar8 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::coeff
                         ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)width,j_1,0);
      std::ostream::operator<<(pMVar2,*pSVar8);
      for (local_230 = 1;
          IVar7 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::cols
                            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)width),
          local_230 < IVar7; local_230 = local_230 + 1) {
        std::operator<<((ostream *)_m_local,(string *)(m + 0xc));
        if (explicit_precision != 0) {
          std::ios_base::width
                    ((ios_base *)
                     ((long)&(_m_local->
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                             m_storage.m_data +
                     (long)(_m_local->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                           ).m_storage.m_data[-3]),explicit_precision);
        }
        pMVar2 = _m_local;
        pSVar8 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::coeff
                           ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)width,j_1,
                            local_230);
        std::ostream::operator<<(pMVar2,*pSVar8);
      }
      std::operator<<((ostream *)_m_local,(string *)(m + 6));
      IVar7 = PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
                        ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)width);
      if (j_1 < IVar7 + -1) {
        std::operator<<((ostream *)_m_local,(string *)(m + 8));
      }
    }
    std::operator<<((ostream *)_m_local,(string *)(m + 2));
    if (old_precision != 0) {
      std::ios_base::precision
                ((ios_base *)
                 ((long)&(_m_local->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data +
                 (long)(_m_local->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data[-3]),sStack_48);
    }
    s_local = (ostream *)_m_local;
  }
  return s_local;
}

Assistant:

std::ostream & print_matrix(std::ostream & s, const Derived& _m, const IOFormat& fmt)
{
  if(_m.size() == 0)
  {
    s << fmt.matPrefix << fmt.matSuffix;
    return s;
  }
  
  typename Derived::Nested m = _m;
  typedef typename Derived::Scalar Scalar;

  Index width = 0;

  std::streamsize explicit_precision;
  if(fmt.precision == StreamPrecision)
  {
    explicit_precision = 0;
  }
  else if(fmt.precision == FullPrecision)
  {
    if (NumTraits<Scalar>::IsInteger)
    {
      explicit_precision = 0;
    }
    else
    {
      explicit_precision = significant_decimals_impl<Scalar>::run();
    }
  }
  else
  {
    explicit_precision = fmt.precision;
  }

  std::streamsize old_precision = 0;
  if(explicit_precision) old_precision = s.precision(explicit_precision);

  bool align_cols = !(fmt.flags & DontAlignCols);
  if(align_cols)
  {
    // compute the largest width
    for(Index j = 0; j < m.cols(); ++j)
      for(Index i = 0; i < m.rows(); ++i)
      {
        std::stringstream sstr;
        sstr.copyfmt(s);
        sstr << m.coeff(i,j);
        width = std::max<Index>(width, Index(sstr.str().length()));
      }
  }
  s << fmt.matPrefix;
  for(Index i = 0; i < m.rows(); ++i)
  {
    if (i)
      s << fmt.rowSpacer;
    s << fmt.rowPrefix;
    if(width) s.width(width);
    s << m.coeff(i, 0);
    for(Index j = 1; j < m.cols(); ++j)
    {
      s << fmt.coeffSeparator;
      if (width) s.width(width);
      s << m.coeff(i, j);
    }
    s << fmt.rowSuffix;
    if( i < m.rows() - 1)
      s << fmt.rowSeparator;
  }
  s << fmt.matSuffix;
  if(explicit_precision) s.precision(old_precision);
  return s;
}